

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestEagerMaybeLazy::_InternalSerialize
          (TestEagerMaybeLazy *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  TestAllTypes *pTVar2;
  TestEagerMaybeLazy_NestedMessage *value;
  bool bVar3;
  int iVar4;
  uint32_t *puVar5;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  TestEagerMaybeLazy *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestEagerMaybeLazy *this_local;
  
  puVar5 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar5;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    pTVar2 = (this->field_0)._impl_.message_foo_;
    iVar4 = proto2_unittest::TestAllTypes::GetCachedSize((this->field_0)._impl_.message_foo_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (1,(MessageLite *)pTVar2,iVar4,target,stream);
  }
  if ((uVar1 & 2) != 0) {
    pTVar2 = (this->field_0)._impl_.message_bar_;
    iVar4 = proto2_unittest::TestAllTypes::GetCachedSize((this->field_0)._impl_.message_bar_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)pTVar2,iVar4,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 4) != 0) {
    value = (this->field_0)._impl_.message_baz_;
    iVar4 = TestEagerMaybeLazy_NestedMessage::GetCachedSize((this->field_0)._impl_.message_baz_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)value,iVar4,(uint8_t *)stream_local,stream);
  }
  bVar3 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar3) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestEagerMaybeLazy::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestEagerMaybeLazy& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestEagerMaybeLazy)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.TestAllTypes message_foo = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.message_foo_, this_._impl_.message_foo_->GetCachedSize(), target,
        stream);
  }

  // .proto2_unittest.TestAllTypes message_bar = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.message_bar_, this_._impl_.message_bar_->GetCachedSize(), target,
        stream);
  }

  // .proto2_unittest.TestEagerMaybeLazy.NestedMessage message_baz = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.message_baz_, this_._impl_.message_baz_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestEagerMaybeLazy)
  return target;
}